

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::readGlobals(WasmBinaryBuilder *this)

{
  Module *this_00;
  bool bVar1;
  uint32_t uVar2;
  ostream *this_01;
  void *this_02;
  Name name;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Name local_88;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_78;
  Expression *local_70;
  Expression *init;
  allocator<char> local_51;
  string local_50;
  uint32_t local_2c;
  Type TStack_28;
  uint32_t mutable_;
  Type type;
  size_t i;
  size_t num;
  WasmBinaryBuilder *this_local;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"== readGlobals\n");
  }
  uVar2 = getU32LEB(this);
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    this_01 = std::operator<<((ostream *)&std::cerr,"num: ");
    this_02 = (void *)std::ostream::operator<<(this_01,(ulong)uVar2);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  }
  type.id = 0;
  while( true ) {
    if (uVar2 <= type.id) {
      return;
    }
    bVar1 = isDebugEnabled("binary");
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,"read one\n");
    }
    TStack_28 = getConcreteType(this);
    local_2c = getU32LEB(this);
    if ((local_2c & 0xfffffffe) != 0) break;
    local_70 = readExpression(this);
    this_00 = this->wasm;
    std::__cxx11::to_string(&local_c8,type.id);
    std::operator+(&local_a8,"global$",&local_c8);
    wasm::Name::Name(&local_88,&local_a8);
    name.super_IString.str._M_str = (char *)local_88.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_78;
    Builder::makeGlobal(name,(Type)local_88.super_IString.str._M_str,(Expression *)TStack_28.id,
                        (Mutability)local_70);
    Module::addGlobal(this_00,&local_78);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_78);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    type.id = type.id + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Global mutability must be 0 or 1",&local_51);
  throwError(this,&local_50);
}

Assistant:

void WasmBinaryBuilder::readGlobals() {
  BYN_TRACE("== readGlobals\n");
  size_t num = getU32LEB();
  BYN_TRACE("num: " << num << std::endl);
  for (size_t i = 0; i < num; i++) {
    BYN_TRACE("read one\n");
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    wasm.addGlobal(
      Builder::makeGlobal("global$" + std::to_string(i),
                          type,
                          init,
                          mutable_ ? Builder::Mutable : Builder::Immutable));
  }
}